

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v7::detail::fallback_format<long_double>(longdouble d,buffer<char> *buf,int *exp10)

{
  int *this;
  int *rhs;
  char *pcVar1;
  undefined8 uVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  undefined1 local_308 [8];
  bigint upper_store;
  bigint numerator;
  bigint lower;
  bigint denominator;
  
  numerator.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  upper_store._168_8_ = &PTR_grow_002afc50;
  numerator.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&numerator.bigits_.super_buffer<unsigned_int>.capacity_;
  numerator.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  numerator.bigits_._160_4_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  lower._168_8_ = &PTR_grow_002afc50;
  denominator.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&denominator.bigits_.super_buffer<unsigned_int>.capacity_;
  denominator.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  denominator.bigits_._160_4_ = 0;
  lower.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  numerator._168_8_ = &PTR_grow_002afc50;
  lower.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&lower.bigits_.super_buffer<unsigned_int>.capacity_;
  lower.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  lower.bigits_._160_4_ = 0;
  upper_store.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  local_308 = (undefined1  [8])&PTR_grow_002afc50;
  upper_store.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&upper_store.bigits_.super_buffer<unsigned_int>.capacity_;
  upper_store.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  upper_store.bigits_._160_4_ = 0;
  bigint::assign((bigint *)&upper_store.exp_,0);
  bigint::operator<<=((bigint *)&upper_store.exp_,0);
  bigint::assign((bigint *)&numerator.exp_,1);
  bigint::operator<<=((bigint *)&numerator.exp_,0);
  bigint::assign_pow10((bigint *)&lower.exp_,*exp10);
  bigint::operator<<=((bigint *)&lower.exp_,1);
  pcVar1 = buf->ptr_;
  lVar9 = 0;
  this = &upper_store.exp_;
  rhs = &numerator.exp_;
  denominator._168_8_ = buf;
  while( true ) {
    uVar4 = bigint::divmod_assign((bigint *)this,(bigint *)&lower.exp_);
    iVar5 = compare((bigint *)this,(bigint *)rhs);
    iVar6 = add_compare((bigint *)this,(bigint *)rhs,(bigint *)&lower.exp_);
    pcVar1[lVar9] = (char)uVar4 + '0';
    if ((iVar5 < 1) || (-1 < iVar6)) break;
    bigint::multiply((bigint *)this,10);
    lVar9 = lVar9 + 1;
    bigint::multiply((bigint *)rhs,10);
  }
  if (iVar5 < 1) {
    if (iVar6 < 0) goto LAB_0022a97b;
    iVar5 = add_compare((bigint *)&upper_store.exp_,(bigint *)&upper_store.exp_,
                        (bigint *)&lower.exp_);
    if ((iVar5 < 1) && ((uVar4 & 1) == 0 || iVar5 != 0)) goto LAB_0022a97b;
    cVar3 = pcVar1[lVar9] + '\x01';
  }
  else {
    cVar3 = (char)uVar4 + '1';
  }
  pcVar1[lVar9] = cVar3;
LAB_0022a97b:
  uVar2 = denominator._168_8_;
  uVar8 = lVar9 + 1U & 0xffffffff;
  uVar7 = *(ulong *)(denominator._168_8_ + 0x18);
  if (uVar7 < uVar8) {
    (*(code *)**(undefined8 **)denominator._168_8_)(denominator._168_8_,uVar8);
    uVar7 = *(ulong *)(uVar2 + 0x18);
  }
  if (uVar7 < uVar8) {
    uVar8 = uVar7;
  }
  *(ulong *)(uVar2 + 0x10) = uVar8;
  *exp10 = *exp10 - (int)lVar9;
  bigint::~bigint((bigint *)local_308);
  bigint::~bigint((bigint *)&numerator.exp_);
  bigint::~bigint((bigint *)&lower.exp_);
  bigint::~bigint((bigint *)&upper_store.exp_);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.try_resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}